

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void roaring_bitmap_repair_after_lazy(roaring_bitmap_t *r)

{
  undefined1 uVar1;
  container_t *pcVar2;
  int *in_RDI;
  container_t *new_c;
  uint8_t new_type;
  container_t *old_c;
  uint8_t old_type;
  int i;
  roaring_array_t *ra;
  undefined4 in_stack_ffffffffffffffe8;
  int iVar3;
  
  for (iVar3 = 0; iVar3 < *in_RDI; iVar3 = iVar3 + 1) {
    uVar1 = *(undefined1 *)(*(long *)(in_RDI + 6) + (long)iVar3);
    in_stack_ffffffffffffffe8 = CONCAT13(uVar1,(int3)in_stack_ffffffffffffffe8);
    pcVar2 = container_repair_after_lazy
                       ((container_t *)CONCAT44(iVar3,in_stack_ffffffffffffffe8),
                        *(uint8_t **)(*(long *)(in_RDI + 2) + (long)iVar3 * 8));
    *(container_t **)(*(long *)(in_RDI + 2) + (long)iVar3 * 8) = pcVar2;
    *(undefined1 *)(*(long *)(in_RDI + 6) + (long)iVar3) = uVar1;
  }
  return;
}

Assistant:

void roaring_bitmap_repair_after_lazy(roaring_bitmap_t *r) {
    roaring_array_t *ra = &r->high_low_container;

    for (int i = 0; i < ra->size; ++i) {
        const uint8_t old_type = ra->typecodes[i];
        container_t *old_c = ra->containers[i];
        uint8_t new_type = old_type;
        container_t *new_c = container_repair_after_lazy(old_c, &new_type);
        ra->containers[i] = new_c;
        ra->typecodes[i] = new_type;
    }
}